

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall WriterTest_Data_Test::TestBody(WriterTest_Data_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  writer w;
  memory_buffer buf;
  AssertHelper local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  internal local_258 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_248;
  basic_buffer<char> local_238;
  char local_218 [504];
  
  local_238.size_ = 0;
  local_238._vptr_basic_buffer = (_func_int **)&PTR_grow_002a3c18;
  local_238.capacity_ = 500;
  local_248.out_.container = &local_238;
  local_248.locale_.locale_ = (void *)0x0;
  local_238.ptr_ = local_218;
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_decimal<int>(&local_248,0x2a);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,local_238.ptr_,local_238.ptr_ + local_238.size_);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_258,"\"42\"","to_string(buf)",(char (*) [3])0x242e5f,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_258[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_278);
    if (local_250.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_250.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x265,message);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_278._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_238._vptr_basic_buffer = (_func_int **)&PTR_grow_002a3c18;
  if (local_238.ptr_ != local_218) {
    operator_delete(local_238.ptr_);
  }
  return;
}

Assistant:

TEST(WriterTest, Data) {
  memory_buffer buf;
  fmt::writer w(buf);
  w.write(42);
  EXPECT_EQ("42", to_string(buf));
}